

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O0

void __thiscall icu_63::double_conversion::Bignum::MultiplyByUInt32(Bignum *this,uint32_t factor)

{
  uint *puVar1;
  DoubleChunk product;
  ulong uStack_20;
  int i;
  DoubleChunk carry;
  uint32_t factor_local;
  Bignum *this_local;
  
  if (factor != 1) {
    if (factor == 0) {
      Zero(this);
    }
    else if (this->used_digits_ != 0) {
      uStack_20 = 0;
      for (product._4_4_ = 0; product._4_4_ < this->used_digits_; product._4_4_ = product._4_4_ + 1)
      {
        puVar1 = Vector<unsigned_int>::operator[](&this->bigits_,product._4_4_);
        uStack_20 = (ulong)factor * (ulong)*puVar1 + uStack_20;
        puVar1 = Vector<unsigned_int>::operator[](&this->bigits_,product._4_4_);
        *puVar1 = (uint)uStack_20 & 0xfffffff;
        uStack_20 = uStack_20 >> 0x1c;
      }
      for (; uStack_20 != 0; uStack_20 = uStack_20 >> 0x1c) {
        EnsureCapacity(this,this->used_digits_ + 1);
        puVar1 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_);
        *puVar1 = (uint)uStack_20 & 0xfffffff;
        this->used_digits_ = this->used_digits_ + 1;
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt32(uint32_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_digits_ == 0) return;

  // The product of a bigit with the factor is of size kBigitSize + 32.
  // Assert that this number + 1 (for the carry) fits into double chunk.
  ASSERT(kDoubleChunkSize >= kBigitSize + 32 + 1);
  DoubleChunk carry = 0;
  for (int i = 0; i < used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * bigits_[i] + carry;
    bigits_[i] = static_cast<Chunk>(product & kBigitMask);
    carry = (product >> kBigitSize);
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}